

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxdraw.c
# Opt level: O3

wchar_t nh_box_mvwhline(WINDOW_conflict *win,wchar_t y,wchar_t x,wchar_t n,attr_t attrs)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t tmp [2];
  cchar_t ch;
  undefined8 local_4c;
  undefined1 local_44 [28];
  
  if (box_draw_mode == 1) {
    local_4c = 0x2500;
    setcchar(local_44,&local_4c,attrs,attrs >> 8 & 0xff,0);
    iVar1 = wmove(win,y,x);
    if (iVar1 == -1) {
      wVar2 = L'\xffffffff';
    }
    else {
      wVar2 = whline_set(win,local_44,n);
    }
  }
  else {
    wattr_on(win,attrs,0);
    iVar1 = wmove(win,y,x);
    if (iVar1 == -1) {
      wVar2 = L'\xffffffff';
    }
    else {
      wVar2 = whline(win,box_chars[box_draw_mode][8],n);
    }
    wattr_off(win,attrs,0);
  }
  return wVar2;
}

Assistant:

int nh_box_mvwhline(WINDOW *win, int y, int x, int n, attr_t attrs)
{
    if (box_draw_mode == 1) {
	cchar_t ch;
	NH_BOX_SETCCHAR(&ch, HLINE, attrs);
	return mvwhline_set(win, y, x, &ch, n);

    } else {
	int r;
	wattron(win, attrs);
	r = mvwhline(win, y, x, NH_BOX_CHAR(HLINE), n);
	wattroff(win, attrs);
	return r;
    }
}